

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_sizeof(lua_State *L)

{
  CTypeID id_00;
  CTSize nelem;
  CTState *cts_00;
  lua_State *L_00;
  lua_State *in_RDI;
  bool bVar1;
  CType *ct;
  CTSize sz;
  CTypeID id;
  CTState *cts;
  CTState *cts_1;
  CTSize local_5c;
  CTSize local_38;
  
  cts_00 = (CTState *)(ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0xfc);
  cts_00->L = in_RDI;
  id_00 = ffi_checkctype((lua_State *)cts,_sz,(TValue *)ct);
  bVar1 = false;
  if ((in_RDI->base->field_2).it == 0xfffffff5) {
    bVar1 = (*(byte *)((ulong)(in_RDI->base->u32).lo + 4) & 0x80) != 0;
  }
  if (bVar1) {
    local_38 = *(CTSize *)((ulong)(in_RDI->base->u32).lo - 4);
  }
  else {
    L_00 = (lua_State *)lj_ctype_rawref(cts_00,id_00);
    if (((L_00->nextgc).gcptr32 & 0xd0100000) == 0x10100000) {
      nelem = ffi_checkint(L_00,0);
      local_38 = lj_ctype_vlsize(cts_00,(CType *)L_00,nelem);
    }
    else {
      if ((L_00->nextgc).gcptr32 >> 0x1c < 6) {
        local_5c._0_1_ = L_00->marked;
        local_5c._1_1_ = L_00->gct;
        local_5c._2_1_ = L_00->dummy_ffid;
        local_5c._3_1_ = L_00->status;
      }
      else {
        local_5c = 0xffffffff;
      }
      local_38 = local_5c;
    }
    if (local_38 == 0xffffffff) {
      *(undefined4 *)((long)in_RDI->top + -4) = 0xffffffff;
      return 1;
    }
  }
  in_RDI->top[-1].n = (double)(int)local_38;
  return 1;
}

Assistant:

LJLIB_CF(ffi_sizeof)	LJLIB_REC(ffi_xof FF_ffi_sizeof)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, NULL);
  CTSize sz;
  if (LJ_UNLIKELY(tviscdata(L->base) && cdataisv(cdataV(L->base)))) {
    sz = cdatavlen(cdataV(L->base));
  } else {
    CType *ct = lj_ctype_rawref(cts, id);
    if (ctype_isvltype(ct->info))
      sz = lj_ctype_vlsize(cts, ct, (CTSize)ffi_checkint(L, 2));
    else
      sz = ctype_hassize(ct->info) ? ct->size : CTSIZE_INVALID;
    if (LJ_UNLIKELY(sz == CTSIZE_INVALID)) {
      setnilV(L->top-1);
      return 1;
    }
  }
  setintV(L->top-1, (int32_t)sz);
  return 1;
}